

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O3

cf_void_t cf_hashtbl_set(cf_hashtbl_t *self,cf_void_t *key,cf_size_t len,cf_void_t *value)

{
  hashtbl_node_t **pphVar1;
  hashtbl_node_t *phVar2;
  byte bVar3;
  int iVar4;
  cf_size_t cVar5;
  hashtbl_node_t *__ptr;
  hashtbl_node_t *phVar6;
  hashtbl_node **pphVar7;
  hashtbl_node_t *phVar8;
  uint uVar9;
  
  if (value != (cf_void_t *)0x0) {
    phVar6 = hashtbl_get_node(self,key,len,1);
    if (phVar6 != (hashtbl_node_t *)0x0) {
      phVar6->value = value;
    }
    return;
  }
  if (len == 0xffffffffffffffff) {
    bVar3 = *key;
    if (bVar3 == 0) {
      uVar9 = 0;
      len = 1;
    }
    else {
      uVar9 = 0;
      len = 1;
      do {
        uVar9 = uVar9 * 0x21 + (uint)bVar3;
        bVar3 = *(byte *)((long)key + len);
        len = len + 1;
      } while (bVar3 != 0);
    }
  }
  else if (len == 0) {
    len = 0;
    uVar9 = 0;
  }
  else {
    cVar5 = 0;
    uVar9 = 0;
    do {
      uVar9 = (uint)*(byte *)((long)key + cVar5) + uVar9 * 0x21;
      cVar5 = cVar5 + 1;
    } while (len != cVar5);
  }
  uVar9 = uVar9 & self->hashmsk;
  pphVar1 = self->table;
  phVar6 = pphVar1[uVar9];
  if (phVar6 != (hashtbl_node_t *)0x0) {
    phVar2 = phVar6;
    phVar8 = (hashtbl_node_t *)0x0;
    do {
      __ptr = phVar2;
      if ((((__ptr->hash == uVar9) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
         (iVar4 = bcmp(__ptr->key,key,len), iVar4 == 0)) {
        pphVar7 = &phVar8->next;
        if (phVar6 == __ptr) {
          pphVar7 = pphVar1 + uVar9;
        }
        *pphVar7 = __ptr->next;
        if (self->callback != (cf_hashtbl_cb_f)0x0) {
          (*self->callback)(__ptr->value);
        }
        free(__ptr->key);
        free(__ptr);
        self->size = self->size - 1;
        return;
      }
      phVar2 = __ptr->next;
      phVar8 = __ptr;
    } while (__ptr->next != (hashtbl_node *)0x0);
  }
  return;
}

Assistant:

cf_void_t cf_hashtbl_set(cf_hashtbl_t* self, const cf_void_t* key, cf_size_t len, cf_void_t* value) {
    hashtbl_node_t* node = CF_NULL_PTR;

    /* clear item */
    if (value == CF_NULL_PTR) {
        hashtbl_remove_node(self, key, len);
        return;
    }

    node = hashtbl_get_node(self, key, len, CF_TRUE);
    if (node) {
        node->value = value;
    }
}